

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_type_enums
                 (lysc_ctx *ctx,lysp_type_enum *enums_p,LY_DATA_TYPE basetype,
                 lysc_type_bitenum_item *base_enums,lysc_type_bitenum_item **bitenums)

{
  lysp_type_enum *plVar1;
  long *plVar2;
  uint *puVar3;
  long lVar4;
  lysc_type_bitenum_item **pplVar5;
  anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *paVar6;
  int iVar7;
  uint uVar8;
  LY_ERR LVar9;
  long *plVar10;
  void *pvVar11;
  lysp_ext_instance *plVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  lysp_ext_instance *plVar16;
  char *format;
  anon_union_4_2_241f96ab_for_lysc_type_bitenum_item_4 *paVar17;
  uint *puVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ly_ctx *plVar23;
  char *pcVar24;
  long lVar25;
  uint uVar26;
  lysc_type_bitenum_item *plVar27;
  lysp_ext_instance *plVar28;
  ly_bool enabled;
  lysc_type_bitenum_item storage;
  undefined8 in_stack_ffffffffffffff28;
  ly_bool local_c1;
  lysc_type_bitenum_item **local_c0;
  uint local_b4;
  uint local_b0;
  LY_DATA_TYPE local_ac;
  lysc_type_bitenum_item *local_a8;
  ulong local_a0;
  ulong local_98;
  lysp_type_enum *local_90;
  lysc_ctx *local_88;
  lysp_type_enum *local_80;
  ulong local_78;
  int local_6c;
  char **local_68;
  long local_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  lysc_ext_instance *plStack_40;
  char *local_38;
  
  local_c0 = bitenums;
  if ((base_enums != (lysc_type_bitenum_item *)0x0) && (ctx->pmod->version < 2)) {
    plVar23 = ctx->ctx;
    pcVar24 = "Bits";
    if (basetype == LY_TYPE_ENUM) {
      pcVar24 = "Enumeration";
    }
    pcVar14 = "%s type can be subtyped only in YANG 1.1 modules.";
LAB_001460fe:
    ly_vlog(plVar23,(char *)0x0,LYVE_SYNTAX_YANG,pcVar14,pcVar24);
    return LY_EVALID;
  }
  local_98 = 0;
  local_a0 = 0x80000000;
  local_60 = -8;
  local_6c = (uint)(basetype == LY_TYPE_ENUM) << 9;
  lVar25 = 0;
  local_b0 = 0x80000000;
  local_78 = 0;
  local_b4 = 0;
  local_ac = basetype;
  local_a8 = base_enums;
  local_90 = enums_p;
  do {
    if (enums_p == (lysp_type_enum *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(ulong *)&enums_p[-1].flags;
    }
    if (uVar13 <= local_98) {
      return LY_SUCCESS;
    }
    if (local_a8 != (lysc_type_bitenum_item *)0x0) {
      lVar19._0_4_ = local_a8[-1].field_4;
      lVar19._4_2_ = local_a8[-1].flags;
      lVar19._6_2_ = *(undefined2 *)&local_a8[-1].field_0x26;
      if (lVar19 == 0) {
        lVar25 = 0;
      }
      else {
        pcVar24 = enums_p[local_98].name;
        lVar25 = 0;
        plVar27 = local_a8;
        while (iVar7 = strcmp(pcVar24,plVar27->name), iVar7 != 0) {
          lVar25 = lVar25 + 1;
          plVar27 = plVar27 + 1;
          if (lVar19 == lVar25) goto LAB_00146688;
        }
      }
      if (lVar25 == lVar19) {
LAB_00146688:
        pcVar24 = "bits";
        if (local_ac == LY_TYPE_ENUM) {
          pcVar24 = "enumeration";
        }
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid %s - derived type adds new item \"%s\".",pcVar24,enums_p[local_98].name);
        return LY_EVALID;
      }
    }
    uVar13 = local_98;
    plVar1 = enums_p + local_98;
    if (local_ac == LY_TYPE_ENUM) {
      uVar8 = (uint)local_a0;
      if ((enums_p[local_98].flags >> 9 & 1) == 0) {
        if (local_a8 == (lysc_type_bitenum_item *)0x0) {
          if (local_98 == 0) {
            uVar26 = 0;
          }
          else {
            if (uVar8 == 0x7fffffff) {
              plVar23 = ctx->ctx;
              pcVar24 = plVar1->name;
              pcVar14 = 
              "Invalid enumeration - it is not possible to auto-assign enum value for \"%s\" since the highest value is already 2147483647."
              ;
              goto LAB_001460fe;
            }
            uVar26 = uVar8 + 1;
          }
        }
        else {
          uVar26 = local_a8[lVar25].field_4.value;
        }
      }
      else {
        uVar26 = (uint)plVar1->value;
        plVar27 = *local_c0;
        uVar15 = 0xffffffffffffffff;
        paVar6 = &plVar27->field_4;
        while( true ) {
          paVar17 = paVar6;
          if (plVar27 == (lysc_type_bitenum_item *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21._0_4_ = plVar27[-1].field_4;
            uVar21._4_2_ = plVar27[-1].flags;
            uVar21._6_2_ = *(undefined2 *)&plVar27[-1].field_0x26;
          }
          uVar15 = uVar15 + 1;
          if (uVar21 <= uVar15) break;
          paVar6 = paVar17 + 10;
          if (paVar17->value == uVar26) {
            plVar23 = ctx->ctx;
            pcVar24 = plVar1->name;
            pcVar14 = ((lysc_type_bitenum_item *)(paVar17 + -8))->name;
            format = "Invalid enumeration - value %d collide in items \"%s\" and \"%s\".";
LAB_001466f3:
            ly_vlog(plVar23,(char *)0x0,LYVE_SYNTAX_YANG,format,(ulong)uVar26,pcVar24,pcVar14);
            return LY_EVALID;
          }
        }
      }
      if ((int)uVar8 <= (int)uVar26) {
        uVar8 = uVar26;
      }
      local_a0 = (ulong)uVar8;
      local_b0 = uVar26;
    }
    else {
      uVar8 = (uint)local_78;
      if ((enums_p[local_98].flags >> 9 & 1) == 0) {
        if (local_a8 == (lysc_type_bitenum_item *)0x0) {
          if (local_98 == 0) {
            uVar26 = 0;
          }
          else {
            if (uVar8 == 0xffffffff) {
              plVar23 = ctx->ctx;
              pcVar24 = plVar1->name;
              pcVar14 = 
              "Invalid bits - it is not possible to auto-assign bit position for \"%s\" since the highest value is already 4294967295."
              ;
              goto LAB_001460fe;
            }
            uVar26 = uVar8 + 1;
          }
        }
        else {
          uVar26 = local_a8[lVar25].field_4.position;
        }
      }
      else {
        uVar26 = (uint)plVar1->value;
        plVar27 = *local_c0;
        uVar15 = 0xffffffffffffffff;
        paVar6 = &plVar27->field_4;
        while( true ) {
          paVar17 = paVar6;
          if (plVar27 == (lysc_type_bitenum_item *)0x0) {
            uVar22 = 0;
          }
          else {
            uVar22._0_4_ = plVar27[-1].field_4;
            uVar22._4_2_ = plVar27[-1].flags;
            uVar22._6_2_ = *(undefined2 *)&plVar27[-1].field_0x26;
          }
          uVar15 = uVar15 + 1;
          if (uVar22 <= uVar15) break;
          paVar6 = paVar17 + 10;
          if (paVar17->value == uVar26) {
            plVar23 = ctx->ctx;
            pcVar24 = plVar1->name;
            pcVar14 = ((lysc_type_bitenum_item *)(paVar17 + -8))->name;
            format = "Invalid bits - position %u collide in items \"%s\" and \"%s\".";
            goto LAB_001466f3;
          }
        }
      }
      local_78 = local_78 & 0xffffffff;
      local_b4 = uVar26;
      if (uVar8 <= uVar26) {
        local_78 = (ulong)uVar26;
      }
    }
    if (local_a8 != (lysc_type_bitenum_item *)0x0) {
      uVar8 = local_a8[lVar25].field_4.position;
      if (local_ac == LY_TYPE_ENUM) {
        if (local_b0 != uVar8) {
          plVar23 = ctx->ctx;
          pcVar24 = local_90[local_98].name;
          pcVar14 = 
          "Invalid enumeration - value of the item \"%s\" has changed from %d to %d in the derived type."
          ;
          uVar26 = local_b0;
LAB_00146795:
          ly_vlog(plVar23,(char *)0x0,LYVE_SYNTAX_YANG,pcVar14,pcVar24,(ulong)uVar8,
                  CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),uVar26));
          return LY_EVALID;
        }
      }
      else if (local_b4 != uVar8) {
        plVar23 = ctx->ctx;
        pcVar24 = local_90[local_98].name;
        pcVar14 = 
        "Invalid bits - position of the item \"%s\" has changed from %u to %u in the derived type.";
        uVar26 = local_b4;
        goto LAB_00146795;
      }
    }
    plVar27 = *local_c0;
    local_80 = plVar1;
    if (plVar27 == (lysc_type_bitenum_item *)0x0) {
      plVar10 = (long *)malloc(0x30);
      if (plVar10 == (long *)0x0) goto LAB_00146731;
      *plVar10 = 1;
      lVar19 = 1;
    }
    else {
      lVar19 = *(long *)&plVar27[-1].field_4;
      *(long *)&plVar27[-1].field_4 = lVar19 + 1;
      plVar10 = (long *)realloc(&plVar27[-1].field_4,lVar19 * 0x28 + 0x30);
      if (plVar10 == (long *)0x0) {
        *(long *)&(*local_c0)[-1].field_4 = *(long *)&(*local_c0)[-1].field_4 + -1;
LAB_00146731:
        plVar23 = ctx->ctx;
        goto LAB_0014673a;
      }
      lVar19 = *plVar10;
    }
    *local_c0 = (lysc_type_bitenum_item *)(plVar10 + 1);
    plVar2 = plVar10 + lVar19 * 5;
    local_68 = (char **)(plVar2 + -4);
    plVar2[-2] = 0;
    plVar2[-1] = 0;
    *local_68 = (char *)0x0;
    plVar2[-3] = 0;
    *plVar2 = 0;
    LVar9 = lydict_dup(ctx->ctx,local_90[uVar13].name,local_68);
    plVar1 = local_80;
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    puVar3 = (uint *)(plVar10 + lVar19 * 5);
    LVar9 = lydict_dup(ctx->ctx,local_80->dsc,(char **)(puVar3 + -6));
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    LVar9 = lydict_dup(ctx->ctx,plVar1->ref,(char **)(puVar3 + -4));
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    *(ushort *)(puVar3 + 1) = (ushort)(byte)plVar1->flags | (ushort)local_6c;
    *puVar3 = uVar26;
    plVar28 = plVar1->exts;
    local_88 = ctx;
    if (plVar28 != (lysp_ext_instance *)0x0) {
      lVar19 = *(long *)(puVar3 + -2);
      if (lVar19 == 0) {
        pvVar11 = calloc(1,(long)plVar28[-1].exts * 0x48 + 8);
        if (pvVar11 == (void *)0x0) goto LAB_00146737;
        plVar10 = (long *)((long)pvVar11 + 8);
        *(long **)(puVar3 + -2) = plVar10;
        lVar20 = 0;
LAB_001464f4:
        plVar16 = plVar28[-1].exts;
      }
      else {
        lVar20 = *(long *)(lVar19 + -8);
        plVar10 = (long *)realloc((void *)(lVar19 + -8),
                                  ((long)&(plVar28[-1].exts)->name + lVar20 * 2) * 0x48 + 8);
        if (plVar10 == (long *)0x0) {
LAB_00146737:
          plVar23 = local_88->ctx;
LAB_0014673a:
          ly_log(plVar23,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_type_enums");
          return LY_EMEM;
        }
        lVar19 = *plVar10;
        plVar28 = local_80->exts;
        *(long **)(puVar3 + -2) = plVar10 + 1;
        plVar10 = plVar10 + lVar19 * 9 + 1;
        if (plVar28 != (lysp_ext_instance *)0x0) goto LAB_001464f4;
        plVar28 = (lysp_ext_instance *)0x0;
        plVar16 = (lysp_ext_instance *)0x0;
      }
      memset(plVar10,0,((long)&plVar16->name + lVar20) * 0x48);
      lVar19 = 0;
      plVar16 = (lysp_ext_instance *)0x0;
      while( true ) {
        if (plVar28 == (lysp_ext_instance *)0x0) {
          plVar12 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar12 = plVar28[-1].exts;
        }
        if (plVar12 <= plVar16) break;
        lVar20 = *(long *)(puVar3 + -2);
        lVar4 = *(long *)(lVar20 + -8);
        *(long *)(lVar20 + -8) = lVar4 + 1;
        LVar9 = lys_compile_ext(local_88,(lysp_ext_instance *)((long)&plVar28->name + lVar19),
                                (lysc_ext_instance *)(lVar20 + lVar4 * 0x48),local_68);
        if (LVar9 != LY_SUCCESS) {
          if (LVar9 != LY_ENOT) {
            return LVar9;
          }
          *(long *)(*(long *)(puVar3 + -2) + -8) = *(long *)(*(long *)(puVar3 + -2) + -8) + -1;
        }
        plVar16 = (lysp_ext_instance *)((long)&plVar16->name + 1);
        plVar28 = local_80->exts;
        lVar19 = lVar19 + 0x70;
      }
    }
    ctx = local_88;
    LVar9 = lys_eval_iffeatures(local_88->ctx,local_80->iffeatures,&local_c1);
    lVar19 = local_60;
    enums_p = local_90;
    pplVar5 = local_c0;
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    if (local_c1 == '\0') {
      *(byte *)((long)puVar3 + 5) = *(byte *)((long)puVar3 + 5) | 1;
    }
    if (local_ac == LY_TYPE_BITS) {
      if (local_98 != 0) {
        puVar18 = (uint *)((long)&(*local_c0)->name + local_60);
        uVar13 = local_98;
        do {
          if (*puVar18 <= *puVar3) goto LAB_001465f1;
          puVar18 = puVar18 + -10;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      uVar13 = 0;
LAB_001465f1:
      if (local_98 - uVar13 != 0) {
        local_38 = local_68[4];
        local_58 = *local_68;
        pcStack_50 = local_68[1];
        local_48 = local_68[2];
        plStack_40 = (lysc_ext_instance *)local_68[3];
        memmove(*local_c0 + uVar13 + 1,*local_c0 + uVar13,(local_98 - uVar13) * 0x28);
        plVar27 = *pplVar5;
        plVar27[uVar13].name = local_58;
        plVar27[uVar13].dsc = pcStack_50;
        plVar27[uVar13].ref = local_48;
        (&plVar27[uVar13].ref)[1] = (char *)plStack_40;
        *(char **)&plVar27[uVar13].field_4 = local_38;
      }
    }
    local_98 = local_98 + 1;
    local_60 = lVar19 + 0x28;
  } while( true );
}

Assistant:

LY_ERR
lys_compile_type_enums(struct lysc_ctx *ctx, const struct lysp_type_enum *enums_p, LY_DATA_TYPE basetype,
        struct lysc_type_bitenum_item *base_enums, struct lysc_type_bitenum_item **bitenums)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v, match = 0;
    int32_t highest_value = INT32_MIN, cur_val = INT32_MIN;
    uint32_t highest_position = 0, cur_pos = 0;
    struct lysc_type_bitenum_item *e, storage;
    ly_bool enabled;

    if (base_enums && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG, "%s type can be subtyped only in YANG 1.1 modules.",
                basetype == LY_TYPE_ENUM ? "Enumeration" : "Bits");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(enums_p, u) {
        /* perform all checks */
        if (base_enums) {
            /* check the enum/bit presence in the base type - the set of enums/bits in the derived type must be a subset */
            LY_ARRAY_FOR(base_enums, v) {
                if (!strcmp(enums_p[u].name, base_enums[v].name)) {
                    break;
                }
            }
            if (v == LY_ARRAY_COUNT(base_enums)) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid %s - derived type adds new item \"%s\".",
                        basetype == LY_TYPE_ENUM ? "enumeration" : "bits", enums_p[u].name);
                return LY_EVALID;
            }
            match = v;
        }

        if (basetype == LY_TYPE_ENUM) {
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_val = (int32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_val == (*bitenums)[v].value) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid enumeration - value %" PRId32 " collide in items \"%s\" and \"%s\".",
                                cur_val, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_val = base_enums[match].value;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_val = 0;
                } else if (highest_value == INT32_MAX) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - it is not possible to auto-assign enum value for "
                            "\"%s\" since the highest value is already 2147483647.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_val = highest_value + 1;
                }
            }

            /* save highest value for auto assing */
            if (highest_value < cur_val) {
                highest_value = cur_val;
            }
        } else { /* LY_TYPE_BITS */
            if (enums_p[u].flags & LYS_SET_VALUE) {
                /* value assigned by model */
                cur_pos = (uint32_t)enums_p[u].value;
                /* check collision with other values */
                LY_ARRAY_FOR(*bitenums, v) {
                    if (cur_pos == (*bitenums)[v].position) {
                        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                                "Invalid bits - position %" PRIu32 " collide in items \"%s\" and \"%s\".",
                                cur_pos, enums_p[u].name, (*bitenums)[v].name);
                        return LY_EVALID;
                    }
                }
            } else if (base_enums) {
                /* inherit the assigned value */
                cur_pos = base_enums[match].position;
            } else {
                /* assign value automatically */
                if (u == 0) {
                    cur_pos = 0;
                } else if (highest_position == UINT32_MAX) {
                    /* counter overflow */
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - it is not possible to auto-assign bit position for "
                            "\"%s\" since the highest value is already 4294967295.", enums_p[u].name);
                    return LY_EVALID;
                } else {
                    cur_pos = highest_position + 1;
                }
            }

            /* save highest position for auto assing */
            if (highest_position < cur_pos) {
                highest_position = cur_pos;
            }
        }

        /* the assigned values must not change from the derived type */
        if (base_enums) {
            if (basetype == LY_TYPE_ENUM) {
                if (cur_val != base_enums[match].value) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid enumeration - value of the item \"%s\" has changed from %" PRId32 " to %" PRId32
                            " in the derived type.", enums_p[u].name, base_enums[match].value, cur_val);
                    return LY_EVALID;
                }
            } else {
                if (cur_pos != base_enums[match].position) {
                    LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                            "Invalid bits - position of the item \"%s\" has changed from %" PRIu32 " to %" PRIu32
                            " in the derived type.", enums_p[u].name, base_enums[match].position, cur_pos);
                    return LY_EVALID;
                }
            }
        }

        /* add new enum/bit */
        LY_ARRAY_NEW_RET(ctx->ctx, *bitenums, e, LY_EMEM);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].name, e->name, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].dsc, e->dsc, ret, done);
        DUP_STRING_GOTO(ctx->ctx, enums_p[u].ref, e->ref, ret, done);
        e->flags = (enums_p[u].flags & LYS_FLAGS_COMPILED_MASK) | (basetype == LY_TYPE_ENUM ? LYS_IS_ENUM : 0);
        if (basetype == LY_TYPE_ENUM) {
            e->value = cur_val;
        } else {
            e->position = cur_pos;
        }
        COMPILE_EXTS_GOTO(ctx, enums_p[u].exts, e->exts, e, ret, done);

        /* evaluate if-ffeatures */
        LY_CHECK_RET(lys_eval_iffeatures(ctx->ctx, enums_p[u].iffeatures, &enabled));
        if (!enabled) {
            /* set only flag, later resolved and removed */
            e->flags |= LYS_DISABLED;
        }

        if (basetype == LY_TYPE_BITS) {
            /* keep bits ordered by position */
            for (v = u; v && (*bitenums)[v - 1].position > e->position; --v) {}
            if (v != u) {
                memcpy(&storage, e, sizeof *e);
                memmove(&(*bitenums)[v + 1], &(*bitenums)[v], (u - v) * sizeof **bitenums);
                memcpy(&(*bitenums)[v], &storage, sizeof storage);
            }
        }
    }

done:
    return ret;
}